

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteTrigger(sqlite3 *db,Trigger *pTrigger)

{
  if ((pTrigger != (Trigger *)0x0) && (pTrigger->bReturning == '\0')) {
    sqlite3DeleteTriggerStep(db,pTrigger->step_list);
    if (pTrigger->zName != (char *)0x0) {
      sqlite3DbFreeNN(db,pTrigger->zName);
    }
    if (pTrigger->table != (char *)0x0) {
      sqlite3DbFreeNN(db,pTrigger->table);
    }
    if (pTrigger->pWhen != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pTrigger->pWhen);
    }
    sqlite3IdListDelete(db,pTrigger->pColumns);
    sqlite3DbFreeNN(db,pTrigger);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTrigger(sqlite3 *db, Trigger *pTrigger){
  if( pTrigger==0 || pTrigger->bReturning ) return;
  sqlite3DeleteTriggerStep(db, pTrigger->step_list);
  sqlite3DbFree(db, pTrigger->zName);
  sqlite3DbFree(db, pTrigger->table);
  sqlite3ExprDelete(db, pTrigger->pWhen);
  sqlite3IdListDelete(db, pTrigger->pColumns);
  sqlite3DbFree(db, pTrigger);
}